

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeJSONObject
               (DynamicObject *JSONObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  undefined8 in_RAX;
  JavascriptFunction *pJVar2;
  JavascriptMethod entryPoint;
  RuntimeFunction *pRVar3;
  StaticType *type;
  LiteralString *pLVar4;
  uint uVar6;
  ulong uVar5;
  
  uVar6 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,JSONObject,mode,3,0);
  pJVar1 = (((JSONObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pJVar2 = EnsureJSONStringifyFunction(pJVar1);
  uVar5 = (ulong)uVar6 << 0x20;
  (*(JSONObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(JSONObject,0x164,pJVar2,6,0,0,uVar5);
  this = (((((JSONObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
  entryPoint = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JSON::EntryInfo::Stringify);
  pJVar2 = EnsureJSONStringifyFunction(pJVar1);
  ScriptContext::SetBuiltInLibraryFunction(this,entryPoint,pJVar2);
  pRVar3 = DefaultCreateFunction
                     (pJVar1,(FunctionInfo *)JSON::EntryInfo::Parse,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x11d);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(JSONObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(JSONObject,0x11d,pRVar3,6,0,0,uVar5);
  pJVar1 = (((JSONObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  if (((((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    pLVar4 = LiteralString::New(type,L"JSON",4,pJVar1->recycler);
    (*(JSONObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(JSONObject,0x1b,pLVar4,2,0,0,uVar5 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(JSONObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeJSONObject(DynamicObject* JSONObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(JSONObject, mode, 3);
        JavascriptLibrary* library = JSONObject->GetLibrary();
        library->AddMember(JSONObject, PropertyIds::stringify, library->EnsureJSONStringifyFunction());
        JSONObject->GetScriptContext()->SetBuiltInLibraryFunction(JSON::EntryInfo::Stringify.GetOriginalEntryPoint(), library->EnsureJSONStringifyFunction());
        library->AddFunctionToLibraryObject(JSONObject, PropertyIds::parse, &JSON::EntryInfo::Parse, 2);

        if (JSONObject->GetScriptContext()->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(JSONObject, PropertyIds::_symbolToStringTag, JSONObject->GetLibrary()->CreateStringFromCppLiteral(_u("JSON")), PropertyConfigurable);
        }

        JSONObject->SetHasNoEnumerableProperties(true);

        return true;
    }